

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackendOpCodeAttr.cpp
# Opt level: O1

int OpCodeAttr::GetOpCodeDebugAttributes(OpCode op)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined1 *puVar4;
  int *piVar5;
  undefined6 in_register_0000003a;
  uint uVar6;
  
  if ((uint)CONCAT62(in_register_0000003a,op) < 0x100) {
    piVar5 = (int *)(OpcodeDebugAttributes + (ulong)op * 4);
  }
  else {
    if (op < 0x189) {
      uVar6 = op - 0x100;
      if (0x88 < uVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/BackendOpCodeAttr.cpp"
                           ,0x10a,
                           "(opIndex < (sizeof(*__countof_helper(ExtendedOpcodeDebugAttributes)) + 0))"
                           ,
                           "opIndex < (sizeof(*__countof_helper(ExtendedOpcodeDebugAttributes)) + 0)"
                          );
        if (!bVar2) {
LAB_007f6eb6:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      puVar4 = ExtendedOpcodeDebugAttributes;
    }
    else {
      uVar6 = op - 0x18a;
      if (0x328 < uVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/BackendOpCodeAttr.cpp"
                           ,0x10e,
                           "(opIndex < (sizeof(*__countof_helper(BackendOpCodeDebugAttributes)) + 0))"
                           ,
                           "opIndex < (sizeof(*__countof_helper(BackendOpCodeDebugAttributes)) + 0)"
                          );
        if (!bVar2) goto LAB_007f6eb6;
        *puVar3 = 0;
      }
      puVar4 = BackendOpCodeDebugAttributes;
    }
    piVar5 = (int *)(puVar4 + (ulong)uVar6 * 4);
  }
  return *piVar5;
}

Assistant:

static const int GetOpCodeDebugAttributes(Js::OpCode op)
{
    if (op <= Js::OpCode::MaxByteSizedOpcodes)
    {
        AnalysisAssert(op < _countof(OpcodeDebugAttributes));
        return OpcodeDebugAttributes[(int)op];
    }
    else if (op < Js::OpCode::ByteCodeLast)
    {
        uint opIndex = op - (Js::OpCode::MaxByteSizedOpcodes + 1);
        AnalysisAssert(opIndex < _countof(ExtendedOpcodeDebugAttributes));
        return ExtendedOpcodeDebugAttributes[opIndex];
    }
    uint opIndex = op - (Js::OpCode::ByteCodeLast + 1);
    AnalysisAssert(opIndex < _countof(BackendOpCodeDebugAttributes));
    return BackendOpCodeDebugAttributes[opIndex];
}